

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swapchain.cpp
# Opt level: O0

Ptr<Swapchain>
myvk::Swapchain::Create
          (Ptr<Queue> *graphics_queue,Ptr<PresentQueue> *present_queue,bool use_vsync,
          VkImageUsageFlags image_usage)

{
  PFN_vkGetPhysicalDeviceSurfaceFormatsKHR p_Var1;
  PFN_vkGetPhysicalDeviceSurfacePresentModesKHR p_Var2;
  PFN_vkCreateSwapchainKHR p_Var3;
  VkSurfaceKHR pVVar4;
  VkPhysicalDevice pVVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  VkResult VVar9;
  element_type *peVar10;
  element_type *peVar11;
  element_type *this;
  element_type *peVar12;
  element_type *peVar13;
  VkSurfaceFormatKHR *pVVar14;
  VkPresentModeKHR *pVVar15;
  reference pvVar16;
  size_type sVar17;
  uint *puVar18;
  element_type *peVar19;
  VkDevice pVVar20;
  byte in_CL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  uint in_R8D;
  Ptr<Swapchain> PVar21;
  uint32_t queue_family_indices [2];
  VkSwapchainCreateInfoKHR create_info;
  uint32_t image_count;
  int height;
  int width;
  VkExtent2D extent;
  VkPresentModeKHR *i_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *__range2_1;
  VkPresentModeKHR present_mode;
  VkSurfaceFormatKHR *i;
  iterator __end2;
  iterator __begin2;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *__range2;
  VkSurfaceFormatKHR surface_format;
  uint32_t present_mode_count;
  uint32_t format_count;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> present_modes;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> surface_formats;
  VkSurfaceCapabilitiesKHR capabilities;
  VkSurfaceKHR surface;
  VkPhysicalDevice physical_device;
  shared_ptr<myvk::Swapchain> ret;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *in_stack_fffffffffffffd28;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *in_stack_fffffffffffffd30;
  shared_ptr<myvk::Swapchain> *this_00;
  int *in_stack_fffffffffffffd38;
  VkSwapchainKHR pVVar22;
  VkDevice in_stack_fffffffffffffd40;
  size_type in_stack_fffffffffffffd48;
  PFN_vkGetSwapchainImagesKHR p_Var23;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *in_stack_fffffffffffffd50;
  uint32_t local_1b0;
  uint32_t local_1ac;
  VkSwapchainCreateInfoKHR local_1a8;
  uint local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 local_124;
  undefined8 local_120;
  reference local_118;
  VkPresentModeKHR *local_110;
  __normal_iterator<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
  local_108;
  undefined1 *local_100;
  VkPresentModeKHR local_f4;
  reference local_f0;
  VkSurfaceFormatKHR *local_e8;
  __normal_iterator<VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
  local_e0;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *local_d8;
  value_type local_cc;
  undefined4 local_c4;
  uint32_t local_c0;
  uint32_t local_bc;
  undefined1 local_b8 [24];
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> local_a0;
  VkSurfaceCapabilitiesKHR local_84;
  VkSurfaceKHR local_50;
  VkPhysicalDevice local_38;
  shared_ptr<myvk::Swapchain> local_30;
  uint local_20;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_20 = in_R8D;
  std::make_shared<myvk::Swapchain>();
  std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2a05b7);
  std::shared_ptr<myvk::Queue>::operator=
            ((shared_ptr<myvk::Queue> *)in_stack_fffffffffffffd30,
             (shared_ptr<myvk::Queue> *)in_stack_fffffffffffffd28);
  std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2a05e8);
  std::shared_ptr<myvk::PresentQueue>::operator=
            ((shared_ptr<myvk::PresentQueue> *)in_stack_fffffffffffffd30,
             (shared_ptr<myvk::PresentQueue> *)in_stack_fffffffffffffd28);
  peVar10 = std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x2a0609);
  (*(peVar10->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar11 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a062c);
  Device::GetPhysicalDevicePtr(peVar11);
  this = std::__shared_ptr_access<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x2a064b);
  local_38 = PhysicalDevice::GetHandle(this);
  peVar12 = std::__shared_ptr_access<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a067a);
  PresentQueue::GetSurfacePtr(peVar12);
  peVar13 = std::__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a0699);
  local_50 = Surface::GetHandle(peVar13);
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
            ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)0x2a06c8);
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector
            ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)0x2a06d5);
  (*vkGetPhysicalDeviceSurfaceCapabilitiesKHR)(local_38,local_50,&local_84);
  (*vkGetPhysicalDeviceSurfaceFormatsKHR)(local_38,local_50,&local_bc,(VkSurfaceFormatKHR *)0x0);
  if (local_bc != 0) {
    std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::resize
              ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
               in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    pVVar5 = local_38;
    pVVar4 = local_50;
    p_Var1 = vkGetPhysicalDeviceSurfaceFormatsKHR;
    pVVar14 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::data
                        ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)0x2a0788
                        );
    (*p_Var1)(pVVar5,pVVar4,&local_bc,pVVar14);
  }
  (*vkGetPhysicalDeviceSurfacePresentModesKHR)(local_38,local_50,&local_c0,(VkPresentModeKHR *)0x0);
  if (local_c0 != 0) {
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::resize
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    pVVar5 = local_38;
    pVVar4 = local_50;
    p_Var2 = vkGetPhysicalDeviceSurfacePresentModesKHR;
    pVVar15 = std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::data
                        ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)0x2a088a);
    (*p_Var2)(pVVar5,pVVar4,&local_c0,pVVar15);
  }
  bVar6 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::empty
                    ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
                     in_stack_fffffffffffffd40);
  if ((bVar6) ||
     (bVar6 = std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::empty
                        ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)
                         in_stack_fffffffffffffd40), bVar6)) {
    std::shared_ptr<myvk::Swapchain>::shared_ptr
              ((shared_ptr<myvk::Swapchain> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  else {
    pvVar16 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::front
                        (in_stack_fffffffffffffd30);
    local_cc = *pvVar16;
    sVar17 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::size(&local_a0);
    if ((sVar17 == 1) &&
       (pvVar16 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::front
                            (in_stack_fffffffffffffd30), pvVar16->format == VK_FORMAT_UNDEFINED)) {
      local_cc.format = VK_FORMAT_B8G8R8A8_UNORM;
    }
    else {
      local_d8 = &local_a0;
      local_e0._M_current =
           (VkSurfaceFormatKHR *)
           std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::begin
                     ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
                      in_stack_fffffffffffffd28);
      local_e8 = (VkSurfaceFormatKHR *)
                 std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::end
                           ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
                            in_stack_fffffffffffffd28);
      while (bVar6 = __gnu_cxx::
                     operator==<VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
                               ((__normal_iterator<VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
                                 *)in_stack_fffffffffffffd30,
                                (__normal_iterator<VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
                                 *)in_stack_fffffffffffffd28), ((bVar6 ^ 0xffU) & 1) != 0) {
        local_f0 = __gnu_cxx::
                   __normal_iterator<VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
                   ::operator*(&local_e0);
        if (local_f0->format == VK_FORMAT_B8G8R8A8_UNORM) {
          local_cc.format = local_f0->format;
          local_cc.colorSpace = local_f0->colorSpace;
          break;
        }
        __gnu_cxx::
        __normal_iterator<VkSurfaceFormatKHR_*,_std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>_>
        ::operator++(&local_e0);
      }
    }
    local_f4 = VK_PRESENT_MODE_FIFO_KHR;
    if ((local_19 & 1) == 0) {
      local_f4 = VK_PRESENT_MODE_IMMEDIATE_KHR;
      local_100 = local_b8;
      local_108._M_current =
           (VkPresentModeKHR *)
           std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::begin
                     (in_stack_fffffffffffffd28);
      local_110 = (VkPresentModeKHR *)
                  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::end
                            (in_stack_fffffffffffffd28);
      while (bVar6 = __gnu_cxx::
                     operator==<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
                               ((__normal_iterator<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
                                 *)in_stack_fffffffffffffd30,
                                (__normal_iterator<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
                                 *)in_stack_fffffffffffffd28), ((bVar6 ^ 0xffU) & 1) != 0) {
        local_118 = __gnu_cxx::
                    __normal_iterator<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
                    ::operator*(&local_108);
        if (*local_118 == VK_PRESENT_MODE_MAILBOX_KHR) {
          local_f4 = *local_118;
          break;
        }
        __gnu_cxx::
        __normal_iterator<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
        ::operator++(&local_108);
      }
    }
    local_120 = CONCAT44(local_84.currentExtent.height,local_84.currentExtent.width);
    if (local_84.currentExtent.width == 0xffffffff) {
      peVar12 = std::
                __shared_ptr_access<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2a0ad4);
      PresentQueue::GetSurfacePtr(peVar12);
      peVar13 = std::__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2a0af3);
      Surface::GetGlfwWindow(peVar13);
      glfwGetWindowSize((GLFWwindow *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                        (int *)in_stack_fffffffffffffd30);
      local_130 = local_124;
      uStack_12c = local_128;
      local_120._4_4_ = local_128;
      puVar18 = std::min<unsigned_int>(&local_84.maxImageExtent.width,(uint *)&local_120);
      puVar18 = std::max<unsigned_int>(&local_84.minImageExtent.width,puVar18);
      local_120 = CONCAT44(local_120._4_4_,*puVar18);
      puVar18 = std::min<unsigned_int>
                          (&local_84.maxImageExtent.height,(uint *)((long)&local_120 + 4));
      puVar18 = std::max<unsigned_int>(&local_84.minImageExtent.height,puVar18);
      local_120 = CONCAT44(*puVar18,(uint)local_120);
    }
    local_134 = local_84.minImageCount + 1;
    if ((local_84.maxImageCount != 0) && (local_84.maxImageCount < local_134)) {
      local_134 = local_84.maxImageCount;
    }
    local_1a8.preTransform = 0;
    local_1a8.compositeAlpha = 0;
    local_1a8.presentMode = VK_PRESENT_MODE_IMMEDIATE_KHR;
    local_1a8.clipped = 0;
    local_1a8._64_8_ = 0;
    local_1a8.pQueueFamilyIndices = (uint32_t *)0x0;
    local_1a8.flags = 0;
    local_1a8._20_4_ = 0;
    local_1a8.pNext = (void *)0x0;
    local_1a8.oldSwapchain = (VkSwapchainKHR)0x0;
    local_1a8.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
    local_1a8._4_4_ = 0;
    local_1a8.surface = local_50;
    local_1a8.imageFormat = local_cc.format;
    local_1a8.minImageCount = local_134;
    local_1a8.imageColorSpace = local_cc.colorSpace;
    local_1a8.imageExtent.width = (uint32_t)local_120;
    local_1a8.imageExtent.height = (uint32_t)((ulong)local_120 >> 0x20);
    local_1a8.imageArrayLayers = 1;
    local_1a8.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
    local_1a8.imageUsage = local_20;
    std::__shared_ptr_access<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a0cef);
    uVar7 = Queue::GetFamilyIndex((Queue *)0x2a0cf7);
    std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a0d0a);
    uVar8 = Queue::GetFamilyIndex((Queue *)0x2a0d12);
    if (uVar7 == uVar8) {
      local_1a8._56_8_ = local_1a8._56_8_ & 0xffffffff;
      local_1a8._64_8_ = local_1a8._64_8_ & 0xffffffff00000000;
      local_1a8.pQueueFamilyIndices = (uint32_t *)0x0;
    }
    else {
      std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2a0d35);
      local_1b0 = Queue::GetFamilyIndex((Queue *)0x2a0d3d);
      std::__shared_ptr_access<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2a0d68);
      local_1ac = Queue::GetFamilyIndex((Queue *)0x2a0d70);
      local_1a8.imageSharingMode = 1;
      local_1a8.queueFamilyIndexCount = 2;
      local_1a8.pQueueFamilyIndices = &local_1b0;
    }
    local_1a8.compositeAlpha = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
    local_1a8.preTransform = local_84.currentTransform;
    local_1a8.clipped = 1;
    local_1a8.presentMode = local_f4;
    local_1a8.oldSwapchain = (VkSwapchainKHR)0x0;
    peVar19 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a0e16);
    (peVar19->m_swapchain_create_info).oldSwapchain = local_1a8.oldSwapchain;
    (peVar19->m_swapchain_create_info).preTransform = local_1a8.preTransform;
    (peVar19->m_swapchain_create_info).compositeAlpha = local_1a8.compositeAlpha;
    (peVar19->m_swapchain_create_info).presentMode = local_1a8.presentMode;
    (peVar19->m_swapchain_create_info).clipped = local_1a8.clipped;
    (peVar19->m_swapchain_create_info).queueFamilyIndexCount = local_1a8.queueFamilyIndexCount;
    *(undefined4 *)&(peVar19->m_swapchain_create_info).field_0x44 = local_1a8._68_4_;
    (peVar19->m_swapchain_create_info).pQueueFamilyIndices = local_1a8.pQueueFamilyIndices;
    *(ulong *)&(peVar19->m_swapchain_create_info).imageExtent.height =
         CONCAT44(local_1a8.imageArrayLayers,local_1a8.imageExtent.height);
    (peVar19->m_swapchain_create_info).imageUsage = local_1a8.imageUsage;
    (peVar19->m_swapchain_create_info).imageSharingMode = local_1a8.imageSharingMode;
    (peVar19->m_swapchain_create_info).minImageCount = local_1a8.minImageCount;
    (peVar19->m_swapchain_create_info).imageFormat = local_1a8.imageFormat;
    (peVar19->m_swapchain_create_info).imageColorSpace = local_1a8.imageColorSpace;
    (peVar19->m_swapchain_create_info).imageExtent.width = local_1a8.imageExtent.width;
    (peVar19->m_swapchain_create_info).flags = local_1a8.flags;
    *(undefined4 *)&(peVar19->m_swapchain_create_info).field_0x14 = local_1a8._20_4_;
    (peVar19->m_swapchain_create_info).surface = local_1a8.surface;
    (peVar19->m_swapchain_create_info).sType = local_1a8.sType;
    *(undefined4 *)&(peVar19->m_swapchain_create_info).field_0x4 = local_1a8._4_4_;
    (peVar19->m_swapchain_create_info).pNext = local_1a8.pNext;
    p_Var3 = vkCreateSwapchainKHR;
    peVar10 = std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a0e8f);
    (*(peVar10->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    peVar11 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a0eac);
    pVVar20 = Device::GetHandle(peVar11);
    peVar19 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a0ec8);
    VVar9 = (*p_Var3)(pVVar20,&local_1a8,(VkAllocationCallbacks *)0x0,&peVar19->m_swapchain);
    if (VVar9 == VK_SUCCESS) {
      p_Var23 = vkGetSwapchainImagesKHR;
      peVar10 = std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2a0f31);
      (*(peVar10->super_DeviceObjectBase).super_Base._vptr_Base[2])();
      peVar11 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2a0f4e);
      in_stack_fffffffffffffd40 = Device::GetHandle(peVar11);
      this_00 = &local_30;
      peVar19 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x2a0f6f);
      pVVar22 = peVar19->m_swapchain;
      peVar19 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x2a0f82);
      (*p_Var23)(in_stack_fffffffffffffd40,pVVar22,&peVar19->m_image_count,(VkImage *)0x0);
      std::shared_ptr<myvk::Swapchain>::shared_ptr
                (this_00,(shared_ptr<myvk::Swapchain> *)in_stack_fffffffffffffd28);
    }
    else {
      std::shared_ptr<myvk::Swapchain>::shared_ptr
                ((shared_ptr<myvk::Swapchain> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28)
      ;
    }
  }
  local_c4 = 1;
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::~vector
            ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)
             in_stack_fffffffffffffd40);
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::~vector
            ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
             in_stack_fffffffffffffd40);
  std::shared_ptr<myvk::Swapchain>::~shared_ptr((shared_ptr<myvk::Swapchain> *)0x2a0fe8);
  PVar21.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar21.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<Swapchain>)PVar21.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Swapchain> Swapchain::Create(const Ptr<Queue> &graphics_queue, const Ptr<PresentQueue> &present_queue,
                                 bool use_vsync, VkImageUsageFlags image_usage) {
	auto ret = std::make_shared<Swapchain>();
	ret->m_graphics_queue_ptr = graphics_queue;
	ret->m_present_queue_ptr = present_queue;

	VkPhysicalDevice physical_device = graphics_queue->GetDevicePtr()->GetPhysicalDevicePtr()->GetHandle();
	VkSurfaceKHR surface = present_queue->GetSurfacePtr()->GetHandle();

	VkSurfaceCapabilitiesKHR capabilities;
	std::vector<VkSurfaceFormatKHR> surface_formats;
	std::vector<VkPresentModeKHR> present_modes;

	vkGetPhysicalDeviceSurfaceCapabilitiesKHR(physical_device, surface, &capabilities);

	uint32_t format_count;
	vkGetPhysicalDeviceSurfaceFormatsKHR(physical_device, surface, &format_count, nullptr);
	if (format_count != 0) {
		surface_formats.resize(format_count);
		vkGetPhysicalDeviceSurfaceFormatsKHR(physical_device, surface, &format_count, surface_formats.data());
	}
	uint32_t present_mode_count;
	vkGetPhysicalDeviceSurfacePresentModesKHR(physical_device, surface, &present_mode_count, nullptr);
	if (present_mode_count != 0) {
		present_modes.resize(present_mode_count);
		vkGetPhysicalDeviceSurfacePresentModesKHR(physical_device, surface, &present_mode_count, present_modes.data());
	}
	if (surface_formats.empty() || present_modes.empty())
		return nullptr;

	// select surface format
	VkSurfaceFormatKHR surface_format = surface_formats.front();
	if (surface_formats.size() == 1 && surface_formats.front().format == VK_FORMAT_UNDEFINED)
		surface_format.format = VK_FORMAT_B8G8R8A8_UNORM;
	else {
		for (const auto &i : surface_formats)
			if (i.format == VK_FORMAT_B8G8R8A8_UNORM) {
				surface_format = i;
				break;
			}
	}

	// select present mode
	VkPresentModeKHR present_mode = VK_PRESENT_MODE_FIFO_KHR;
	if (!use_vsync) {
		present_mode = VK_PRESENT_MODE_IMMEDIATE_KHR;
		for (const auto &i : present_modes)
			if (i == VK_PRESENT_MODE_MAILBOX_KHR) {
				present_mode = i;
				break;
			}
	}

	// query extent
	VkExtent2D extent = capabilities.currentExtent;
	if (capabilities.currentExtent.width == UINT32_MAX) {
		int width, height;
		glfwGetWindowSize(present_queue->GetSurfacePtr()->GetGlfwWindow(), &width, &height);
		extent = {(uint32_t)width, (uint32_t)height};

		extent.width =
		    std::max(capabilities.minImageExtent.width, std::min(capabilities.maxImageExtent.width, extent.width));
		extent.height =
		    std::max(capabilities.minImageExtent.height, std::min(capabilities.maxImageExtent.height, extent.height));
	}

	// query image count
	uint32_t image_count = capabilities.minImageCount + 1u;
	if (capabilities.maxImageCount > 0 && image_count > capabilities.maxImageCount)
		image_count = capabilities.maxImageCount;

	// create swapchain
	VkSwapchainCreateInfoKHR create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
	create_info.surface = surface;
	create_info.minImageCount = image_count;
	create_info.imageFormat = surface_format.format;
	create_info.imageColorSpace = surface_format.colorSpace;
	create_info.imageExtent = extent;
	create_info.imageArrayLayers = 1;
	create_info.imageUsage = image_usage;

	if (present_queue->GetFamilyIndex() != graphics_queue->GetFamilyIndex()) {
		uint32_t queue_family_indices[] = {graphics_queue->GetFamilyIndex(), present_queue->GetFamilyIndex()};
		create_info.imageSharingMode = VK_SHARING_MODE_CONCURRENT;
		create_info.queueFamilyIndexCount = 2;
		create_info.pQueueFamilyIndices = queue_family_indices;
	} else {
		create_info.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
		create_info.queueFamilyIndexCount = 0;
		create_info.pQueueFamilyIndices = nullptr;
	}
	create_info.preTransform = capabilities.currentTransform;
	create_info.compositeAlpha = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
	create_info.presentMode = present_mode;
	create_info.clipped = VK_TRUE;
	create_info.oldSwapchain = VK_NULL_HANDLE;

	// set constants
	ret->m_swapchain_create_info = create_info;

	if (vkCreateSwapchainKHR(graphics_queue->GetDevicePtr()->GetHandle(), &create_info, nullptr, &ret->m_swapchain) !=
	    VK_SUCCESS)
		return nullptr;

	// get image count
	vkGetSwapchainImagesKHR(graphics_queue->GetDevicePtr()->GetHandle(), ret->m_swapchain, &ret->m_image_count,
	                        nullptr);

	return ret;
}